

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O2

unique_ptr<beast::Journal::Sink,_std::default_delete<beast::Journal::Sink>_> __thiscall
jbcoin::setDebugLogSink
          (jbcoin *this,
          unique_ptr<beast::Journal::Sink,_std::default_delete<beast::Journal::Sink>_> *sink)

{
  Sink *pSVar1;
  pointer *__ptr;
  
  debugSink();
  pSVar1 = (sink->_M_t).
           super___uniq_ptr_impl<beast::Journal::Sink,_std::default_delete<beast::Journal::Sink>_>.
           _M_t.
           super__Tuple_impl<0UL,_beast::Journal::Sink_*,_std::default_delete<beast::Journal::Sink>_>
           .super__Head_base<0UL,_beast::Journal::Sink_*,_false>._M_head_impl;
  (sink->_M_t).
  super___uniq_ptr_impl<beast::Journal::Sink,_std::default_delete<beast::Journal::Sink>_>._M_t.
  super__Tuple_impl<0UL,_beast::Journal::Sink_*,_std::default_delete<beast::Journal::Sink>_>.
  super__Head_base<0UL,_beast::Journal::Sink_*,_false>._M_head_impl = (Sink *)0x0;
  DebugSink::set((DebugSink *)this,
                 (unique_ptr<beast::Journal::Sink,_std::default_delete<beast::Journal::Sink>_> *)
                 &debugSink::_);
  if (pSVar1 != (Sink *)0x0) {
    (*pSVar1->_vptr_Sink[1])();
  }
  return (__uniq_ptr_data<beast::Journal::Sink,_std::default_delete<beast::Journal::Sink>,_true,_true>
          )(__uniq_ptr_data<beast::Journal::Sink,_std::default_delete<beast::Journal::Sink>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<beast::Journal::Sink>
setDebugLogSink(
    std::unique_ptr<beast::Journal::Sink> sink)
{
    return debugSink().set(std::move(sink));
}